

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void ntileStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  long *plVar1;
  i64 iVar2;
  
  if ((pCtx->pMem->flags & 0x2000) == 0) {
    plVar1 = (long *)createAggContext(pCtx,0x18);
  }
  else {
    plVar1 = (long *)pCtx->pMem->z;
  }
  if (plVar1 != (long *)0x0) {
    if (*plVar1 == 0) {
      iVar2 = sqlite3VdbeIntValue(*apArg);
      plVar1[1] = iVar2;
      if (iVar2 < 1) {
        pCtx->isError = 1;
        sqlite3VdbeMemSetStr
                  (pCtx->pOut,"argument of ntile must be a positive integer",-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
      }
    }
    *plVar1 = *plVar1 + 1;
  }
  return;
}

Assistant:

static void ntileStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct NtileCtx *p;
  assert( nArg==1 ); UNUSED_PARAMETER(nArg);
  p = (struct NtileCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nTotal==0 ){
      p->nParam = sqlite3_value_int64(apArg[0]);
      if( p->nParam<=0 ){
        sqlite3_result_error(
            pCtx, "argument of ntile must be a positive integer", -1
        );
      }
    }
    p->nTotal++;
  }
}